

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::NormalizeFindResult(cmFindBase *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  string *psVar4;
  cmake *pcVar5;
  string *psVar6;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string value;
  path local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  path local_c0;
  path local_98;
  path local_70;
  string local_48;
  
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0125,false);
  if (PVar3 != NEW) {
    if (this->StoreResultInCache != true) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&this->VariableName);
      value_02._M_str = (psVar6->_M_dataplus)._M_p;
      value_02._M_len = psVar6->_M_string_length;
      cmMakefile::AddDefinition(pcVar1,&this->VariableName,value_02);
      return;
    }
    if (this->AlreadyInCacheWithoutMetaInfo != true) {
      return;
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"",(allocator<char> *)&local_c0);
    psVar6 = &this->VariableName;
    cmMakefile::AddCacheDefinition
              (pcVar1,psVar6,&local_128._M_pathname,(cmValue)&this->VariableDocumentation,
               this->VariableType,false);
    std::__cxx11::string::~string((string *)&local_128);
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
    if (PVar3 != NEW) {
      return;
    }
    bVar2 = cmMakefile::IsNormalDefinitionSet((this->super_cmFindCommon).Makefile,psVar6);
    if (!bVar2) {
      return;
    }
    pcVar1 = (this->super_cmFindCommon).Makefile;
    pcVar5 = cmMakefile::GetCMakeInstance(pcVar1);
    psVar4 = (string *)cmake::GetCacheDefinition(pcVar5,psVar6);
    if (psVar4 == (string *)0x0) {
      psVar4 = &cmValue::Empty_abi_cxx11_;
    }
    value_01._M_str = (psVar4->_M_dataplus)._M_p;
    value_01._M_len = psVar4->_M_string_length;
    cmMakefile::AddDefinition(pcVar1,psVar6,value_01);
    return;
  }
  psVar6 = &this->VariableName;
  psVar4 = (string *)cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,psVar6);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  if (psVar4->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_e0,(string *)psVar4);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_70,&local_e0,auto_format);
    pcVar5 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
    std::__cxx11::string::string((string *)&local_100,(string *)&pcVar5->CMakeWorkingDirectory);
    cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
              ((cmCMakePath *)&local_98,&local_100,generic_format);
    cmCMakePath::Absolute((cmCMakePath *)&local_c0,(cmCMakePath *)&local_70,&local_98);
    cmCMakePath::Normal((cmCMakePath *)&local_128,(cmCMakePath *)&local_c0);
    std::filesystem::__cxx11::path::generic_string(&local_48,&local_128);
    std::__cxx11::string::operator=((string *)&value,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::filesystem::__cxx11::path::~path(&local_128);
    std::filesystem::__cxx11::path::~path(&local_c0);
    std::filesystem::__cxx11::path::~path(&local_98);
    std::__cxx11::string::~string((string *)&local_100);
    std::filesystem::__cxx11::path::~path(&local_70);
    std::__cxx11::string::~string((string *)&local_e0);
    bVar2 = cmsys::SystemTools::FileExists(&value,false);
    if (!bVar2) {
      std::__cxx11::string::_M_assign((string *)&value);
    }
  }
  if (this->StoreResultInCache == true) {
    bVar2 = std::operator!=(&value,psVar4);
    if ((!bVar2) && (this->AlreadyInCacheWithoutMetaInfo != true)) goto LAB_00492d80;
    pcVar5 = cmMakefile::GetCMakeInstance((this->super_cmFindCommon).Makefile);
    cmake::AddCacheEntry
              (pcVar5,psVar6,&value,(cmValue)&this->VariableDocumentation,this->VariableType);
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0126,false);
    pcVar1 = (this->super_cmFindCommon).Makefile;
    if (PVar3 != NEW) {
      cmMakefile::RemoveDefinition(pcVar1,psVar6);
      goto LAB_00492d80;
    }
    bVar2 = cmMakefile::IsNormalDefinitionSet(pcVar1,psVar6);
    if (!bVar2) goto LAB_00492d80;
  }
  value_00._M_str = value._M_dataplus._M_p;
  value_00._M_len = value._M_string_length;
  cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,psVar6,value_00);
LAB_00492d80:
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void cmFindBase::NormalizeFindResult()
{
  if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0125) ==
      cmPolicies::NEW) {
    // ensure the path returned by find_* command is absolute
    const auto& existingValue =
      this->Makefile->GetDefinition(this->VariableName);
    std::string value;
    if (!existingValue->empty()) {
      value =
        cmCMakePath(*existingValue, cmCMakePath::auto_format)
          .Absolute(cmCMakePath(
            this->Makefile->GetCMakeInstance()->GetCMakeWorkingDirectory()))
          .Normal()
          .GenericString();
      // value = cmSystemTools::CollapseFullPath(*existingValue);
      if (!cmSystemTools::FileExists(value, false)) {
        value = *existingValue;
      }
    }

    if (this->StoreResultInCache) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the original
      // value.
      if (value != *existingValue || this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->GetCMakeInstance()->AddCacheEntry(
          this->VariableName, value, this->VariableDocumentation,
          this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
            cmPolicies::NEW) {
          if (this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
            this->Makefile->AddDefinition(this->VariableName, value);
          }
        } else {
          // if there was a definition then remove it
          // This is required to ensure same behavior as
          // cmMakefile::AddCacheDefinition.
          this->Makefile->RemoveDefinition(this->VariableName);
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(this->VariableName, value);
    }
  } else {
    // If the user specifies the entry on the command line without a
    // type we should add the type and docstring but keep the original
    // value.
    if (this->StoreResultInCache) {
      if (this->AlreadyInCacheWithoutMetaInfo) {
        this->Makefile->AddCacheDefinition(this->VariableName, "",
                                           this->VariableDocumentation,
                                           this->VariableType);
        if (this->Makefile->GetPolicyStatus(cmPolicies::CMP0126) ==
              cmPolicies::NEW &&
            this->Makefile->IsNormalDefinitionSet(this->VariableName)) {
          this->Makefile->AddDefinition(
            this->VariableName,
            *this->Makefile->GetCMakeInstance()->GetCacheDefinition(
              this->VariableName));
        }
      }
    } else {
      // ensure a normal variable is defined.
      this->Makefile->AddDefinition(
        this->VariableName,
        this->Makefile->GetSafeDefinition(this->VariableName));
    }
  }
}